

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

ElementTypeAndOffset * __thiscall
choc::value::Type::ComplexArray::getElementInfo
          (ElementTypeAndOffset *__return_storage_ptr__,ComplexArray *this,uint32_t index)

{
  uint uVar1;
  RepeatedGroup *pRVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  Type *this_00;
  
  pRVar2 = (this->groups).items;
  lVar5 = (ulong)(this->groups).size * 0x28;
  lVar4 = 0;
  while( true ) {
    this_00 = &pRVar2->elementType;
    if (lVar5 == 0) {
      throwError("Index out of range");
    }
    sVar3 = Type::getValueDataSize(this_00);
    uVar1 = *(uint *)((long)(this_00 + -1) + 0x18);
    if (index < uVar1) break;
    index = index - uVar1;
    lVar4 = lVar4 + sVar3 * uVar1;
    pRVar2 = (RepeatedGroup *)(this_00 + 1);
    lVar5 = lVar5 + -0x28;
  }
  Type(&__return_storage_ptr__->elementType,this_00);
  __return_storage_ptr__->offset = sVar3 * index + lVar4;
  return __return_storage_ptr__;
}

Assistant:

ElementTypeAndOffset getElementInfo (uint32_t index) const
    {
        size_t offset = 0;

        for (auto& g : groups)
        {
            auto elementSize = g.elementType.getValueDataSize();

            if (index < g.repetitions)
                return { g.elementType, offset + elementSize * index };

            index -= g.repetitions;
            offset += elementSize * g.repetitions;
        }

        throwError ("Index out of range");
    }